

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner-common.c
# Opt level: O2

int open_plugin(char *raw,char *display,input_ops **ops,input_handle **ih)

{
  int iVar1;
  input_ops *piVar2;
  input_handle *piVar3;
  char *__format;
  
  piVar2 = input_get_ops(raw);
  *ops = piVar2;
  if (piVar2 == (input_ops *)0x0) {
    if (verbose == 0) {
      return 1;
    }
    __format = "No plugin found for file \'%s\'\n";
  }
  else {
    piVar3 = (*piVar2->handle_init)();
    *ih = piVar3;
    iVar1 = (*(*ops)->open_file)(piVar3,raw);
    if (iVar1 == 0) {
      return 0;
    }
    if (verbose == 0) {
      return 1;
    }
    __format = "Error opening file \'%s\'\n";
  }
  fprintf(_stderr,__format,display);
  return 1;
}

Assistant:

int
open_plugin(char const *raw, char const *display, struct input_ops **ops,
    struct input_handle **ih)
{
	int result;

	*ops = input_get_ops(raw);
	if (!(*ops)) {
		if (verbose) {
			fprintf(stderr, "No plugin found for file '%s'\n",
			    display);
		}
		return 1;
	}
	*ih = (*ops)->handle_init();

	result = (*ops)->open_file(*ih, raw);
	if (result) {
		if (verbose) {
			fprintf(stderr, "Error opening file '%s'\n", display);
		}
		return 1;
	}
	return 0;
}